

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<char>_> *
kj::parse::Many_<const_kj::parse::Any__&,_false>::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_char>::apply
          (Maybe<kj::Array<char>_> *__return_storage_ptr__,Any_ *subParser,
          IteratorInput<char,_const_char_*> *input)

{
  ArrayDisposer *pAVar1;
  NullableValue<char> subResult;
  Results results;
  char local_69;
  IteratorInput<char,_const_char_*> local_68;
  ArrayBuilder<char> local_48;
  
  local_48.endPtr = (char *)0x0;
  local_48.ptr = (char *)0x0;
  local_48.pos = (RemoveConst<char> *)0x0;
  while( true ) {
    pAVar1 = (ArrayDisposer *)input->pos;
    if (pAVar1 == (ArrayDisposer *)input->end) break;
    local_68.pos = (char *)((long)&pAVar1->_vptr_ArrayDisposer + 1);
    local_69 = *(char *)&pAVar1->_vptr_ArrayDisposer;
    input->pos = local_68.pos;
    local_68.parent = input;
    local_68.end = input->end;
    local_68.best = (char *)pAVar1;
    Vector<char>::add<char>((Vector<char> *)&local_48,&local_69);
    IteratorInput<char,_const_char_*>::~IteratorInput(&local_68);
  }
  Vector<char>::releaseAsArray((Array<char> *)&local_68,(Vector<char> *)&local_48);
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.ptr = (char *)local_68.parent;
  (__return_storage_ptr__->ptr).field_1.value.size_ = (size_t)local_68.pos;
  (__return_storage_ptr__->ptr).field_1.value.disposer = (ArrayDisposer *)local_68.end;
  local_68.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_68.pos = (char *)0x0;
  Array<char>::~Array((Array<char> *)&local_68);
  ArrayBuilder<char>::dispose(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }